

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O2

err_t beltCHEWrap(void *dest,octet *mac,void *src1,size_t count1,void *src2,size_t count2,octet *key
                 ,size_t len,octet *iv)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src1,count1);
    if (bVar1 != 0) {
      bVar1 = memIsValid(src2,count2);
      if (bVar1 != 0) {
        bVar1 = memIsValid(key,len);
        if (bVar1 != 0) {
          bVar1 = memIsValid(iv,0x10);
          if (bVar1 != 0) {
            bVar1 = memIsValid(dest,count1);
            if (bVar1 != 0) {
              bVar1 = memIsValid(mac,8);
              if (bVar1 != 0) {
                size = beltCHE_keep();
                state = blobCreate(size);
                if (state == (blob_t)0x0) {
                  eVar2 = 0x6e;
                }
                else {
                  beltCHEStart(state,key,len,iv);
                  beltCHEStepI(src2,count2,state);
                  memMove(dest,src1,count1);
                  beltCHEStepE(dest,count1,state);
                  beltCHEStepA(dest,count1,state);
                  beltCHEStepG(mac,state);
                  blobClose(state);
                  eVar2 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltCHEWrap(void* dest, octet mac[8], const void* src1, size_t count1,
	const void* src2, size_t count2, const octet key[], size_t len,
	const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src1, count1) ||
		!memIsValid(src2, count2) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count1) ||
		!memIsValid(mac, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltCHE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// установить защиту (I перед E из-за разрешенного пересечения src2 и dest)
	beltCHEStart(state, key, len, iv);
	beltCHEStepI(src2, count2, state);
	memMove(dest, src1, count1);
	beltCHEStepE(dest, count1, state);
	beltCHEStepA(dest, count1, state);
	beltCHEStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}